

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall
Reducer::tryToRemoveFunctions(std::vector<wasm::Name,std::allocator<wasm::Name>>)::
FunctionReferenceRemover::visitCall(wasm::Call__(void *this,Call *curr)

{
  size_type sVar1;
  Module *wasm;
  Expression *expression;
  Builder local_20;
  Call *local_18;
  Call *curr_local;
  FunctionReferenceRemover *this_local;
  
  local_18 = curr;
  curr_local = (Call *)this;
  sVar1 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)((long)this + 0xd8),(key_type *)(curr + 0x30));
  if (sVar1 != 0) {
    wasm = ::wasm::Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
           ::getModule((Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                        *)this);
    ::wasm::Builder::Builder(&local_20,wasm);
    expression = ::wasm::Builder::replaceWithIdenticalType<wasm::Call>(&local_20,local_18);
    ::wasm::Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>::
    replaceCurrent((Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                    *)this,expression);
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
        if (names.count(curr->target)) {
          replaceCurrent(Builder(*getModule()).replaceWithIdenticalType(curr));
        }
      }